

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_sop_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  
  iVar1 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int jpc_sop_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_sop_t *sop = &ms->parms.sop;

	/* Eliminate compiler warning about unused variable. */
	(void)cstate;

	if (jpc_getuint16(in, &sop->seqno)) {
		return -1;
	}
	return 0;
}